

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O3

double mjs::anon_unknown_37::date_helper::time_from_date_time(date_time *dt)

{
  double dVar1;
  double dVar2;
  
  dVar1 = make_day(dt->year,dt->month,dt->day);
  dVar2 = make_time(dt->h,dt->m,dt->s,dt->ms);
  if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
    dVar2 = dVar1 * 86400000.0 + dVar2;
  }
  else {
    dVar2 = NAN;
  }
  if (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
    dVar2 = NAN;
  }
  return dVar2;
}

Assistant:

static double time_from_date_time(const date_time& dt) {
        return make_date(make_day(dt.year, dt.month, dt.day), make_time(dt.h, dt.m, dt.s, dt.ms));
    }